

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int nodePush(xmlParserCtxtPtr ctxt,xmlNodePtr value)

{
  uint uVar1;
  xmlNodePtr *ppxVar2;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return 0;
  }
  uVar1 = ctxt->nodeNr;
  if (ctxt->nodeMax <= (int)uVar1) {
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(ctxt->nodeTab,(long)ctxt->nodeMax << 4);
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return -1;
    }
    ctxt->nodeTab = ppxVar2;
    ctxt->nodeMax = ctxt->nodeMax << 1;
    uVar1 = ctxt->nodeNr;
  }
  if ((xmlParserMaxDepth < uVar1) && ((ctxt->options & 0x80000) == 0)) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INTERNAL_ERROR,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                      xmlParserMaxDepth);
    xmlHaltParser(ctxt);
    return -1;
  }
  ctxt->nodeTab[(int)uVar1] = value;
  ctxt->node = value;
  ctxt->nodeNr = uVar1 + 1;
  return uVar1;
}

Assistant:

int
nodePush(xmlParserCtxtPtr ctxt, xmlNodePtr value)
{
    if (ctxt == NULL) return(0);
    if (ctxt->nodeNr >= ctxt->nodeMax) {
        xmlNodePtr *tmp;

	tmp = (xmlNodePtr *) xmlRealloc(ctxt->nodeTab,
                                      ctxt->nodeMax * 2 *
                                      sizeof(ctxt->nodeTab[0]));
        if (tmp == NULL) {
            xmlErrMemory(ctxt, NULL);
            return (-1);
        }
        ctxt->nodeTab = tmp;
	ctxt->nodeMax *= 2;
    }
    if ((((unsigned int) ctxt->nodeNr) > xmlParserMaxDepth) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
	xmlFatalErrMsgInt(ctxt, XML_ERR_INTERNAL_ERROR,
		 "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
			  xmlParserMaxDepth);
	xmlHaltParser(ctxt);
	return(-1);
    }
    ctxt->nodeTab[ctxt->nodeNr] = value;
    ctxt->node = value;
    return (ctxt->nodeNr++);
}